

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

void deflate_compress_greedy
               (libdeflate_compressor *c,u8 *in,size_t in_nbytes,deflate_output_bitstream *os)

{
  undefined8 *puVar1;
  uint *puVar2;
  int *piVar3;
  ulong *puVar4;
  ulong *puVar5;
  u32 *puVar6;
  byte bVar7;
  short sVar8;
  ulong uVar9;
  ushort uVar10;
  _Bool _Var11;
  u32 uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  u32 uVar18;
  uint *data;
  byte *pbVar19;
  uint *puVar20;
  uint *puVar21;
  uint uVar22;
  ushort uVar23;
  uint *puVar24;
  ulong uVar25;
  uint *puVar26;
  short sVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint local_9c;
  ulong local_90;
  uint local_84;
  int local_80;
  long local_78;
  
  local_9c = c->nice_match_length;
  lVar16 = 0x17c0;
  do {
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x28);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -0x18);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + -8);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    puVar1 = (undefined8 *)((long)(c->freqs).litlen + lVar16 + 8);
    *puVar1 = 0x8000800080008000;
    puVar1[1] = 0x8000800080008000;
    lVar16 = lVar16 + 0x40;
  } while (lVar16 != 0x317c0);
  puVar20 = (uint *)(in + in_nbytes);
  local_90 = 0x102;
  if (0x101 < local_9c) {
    local_9c = 0x102;
  }
  uVar22 = 0;
  uVar29 = 0;
  data = (uint *)in;
LAB_00101493:
  puVar24 = data + 75000;
  if ((ulong)((long)puVar20 - (long)data) < 0x4a768) {
    puVar24 = puVar20;
  }
  (c->p).g.sequences[0].litrunlen_and_length = 0;
  memset(&c->freqs,0,0x558);
  uVar12 = calculate_min_match_len((u8 *)data,(long)puVar24 - (long)data,c->max_search_depth);
  uVar13 = uVar12 - 1;
  local_78 = 0x417c0;
  puVar26 = data;
  auVar32 = _DAT_0010eac0;
LAB_0010150d:
  uVar17 = (long)puVar20 - (long)puVar26;
  if ((uVar17 < 0x102) && (local_90 = uVar17, (uint)uVar17 <= local_9c)) {
    local_9c = (uint)uVar17;
  }
  uVar18 = c->max_search_depth;
  uVar14 = (int)puVar26 - (int)in;
  if (uVar14 == 0x8000) {
    lVar16 = 0;
    do {
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar31;
      auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar32);
      *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar31;
      lVar16 = lVar16 + 0x40;
    } while (lVar16 != 0x40000);
    in = in + 0x8000;
    uVar14 = 0;
  }
  uVar28 = (uint)local_90;
  puVar21 = puVar26;
  if (uVar28 < 5) {
LAB_00101836:
    uVar17 = (ulong)uVar13;
  }
  else {
    uVar10 = (ushort)uVar14;
    uVar23 = uVar10 ^ 0x8000;
    sVar8 = *(short *)((long)&c->p + uVar29 * 2);
    sVar27 = *(short *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000);
    *(ushort *)((long)&c->p + uVar29 * 2) = uVar10;
    *(ushort *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000) = uVar10;
    *(short *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) = sVar27;
    uVar29 = (ulong)((*(uint *)((long)puVar26 + 1) & 0xffffff) * 0x1e35a7bd >> 0x11);
    uVar22 = *(uint *)((long)puVar26 + 1) * 0x1e35a7bd >> 0x10;
    uVar17 = (ulong)uVar13;
    if (3 < uVar13) {
      if ((uVar13 < local_9c) && ((short)uVar23 < sVar27)) goto LAB_001016ca;
      goto LAB_00101836;
    }
    if (sVar8 <= (short)uVar23) goto LAB_00101836;
    uVar17 = 3;
    if (uVar13 != 3) {
      bVar30 = ((*(uint *)(in + sVar8) ^ *puVar26) & 0xffffff) != 0;
      puVar21 = (uint *)(in + sVar8);
      if (bVar30) {
        puVar21 = puVar26;
      }
      uVar17 = (ulong)uVar13;
      if (!bVar30) {
        uVar17 = 3;
      }
    }
    if ((short)uVar23 < sVar27) {
      do {
        uVar18 = uVar18 - 1;
        if (*(uint *)(in + sVar27) == *puVar26) {
          puVar21 = (uint *)(in + sVar27);
          uVar25 = 4;
          if (0xffffffdf < uVar28 - 0x24) goto LAB_00101aef;
          if (*(ulong *)(puVar21 + 1) != *(ulong *)(puVar26 + 1)) {
            uVar17 = *(ulong *)(puVar26 + 1) ^ *(ulong *)(puVar21 + 1);
            uVar14 = 4;
            goto LAB_00101b2f;
          }
          if (*(ulong *)(puVar21 + 3) != *(ulong *)(puVar26 + 3)) {
            uVar17 = *(ulong *)(puVar26 + 3) ^ *(ulong *)(puVar21 + 3);
            uVar14 = 0xc;
            goto LAB_00101b2f;
          }
          if (*(ulong *)(puVar21 + 5) == *(ulong *)(puVar26 + 5)) {
            uVar25 = 0x24;
            if (*(ulong *)(puVar21 + 7) == *(ulong *)(puVar26 + 7)) goto LAB_00101aef;
            uVar17 = *(ulong *)(puVar26 + 7) ^ *(ulong *)(puVar21 + 7);
            uVar14 = 0x1c;
          }
          else {
            uVar17 = *(ulong *)(puVar26 + 5) ^ *(ulong *)(puVar21 + 5);
            uVar14 = 0x14;
          }
          goto LAB_00101b2f;
        }
        sVar27 = *(short *)((long)&c->p + (ulong)((int)sVar27 & 0x7fff) * 2 + 0x30000);
      } while (((short)uVar23 < sVar27) && (uVar18 != 0));
    }
  }
  goto LAB_00101841;
  while( true ) {
    puVar4 = (ulong *)((long)puVar21 + uVar25);
    puVar5 = (ulong *)((long)puVar26 + uVar25);
    uVar25 = (ulong)(uVar14 + 8);
    if (*puVar4 != *puVar5) break;
LAB_00101aef:
    uVar14 = (uint)uVar25;
    if (uVar28 < uVar14 + 8) {
      uVar17 = uVar25;
      if (uVar14 < uVar28) goto LAB_00101ba0;
      goto LAB_00101b3e;
    }
  }
  uVar17 = *puVar5 ^ *puVar4;
LAB_00101b2f:
  uVar25 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
    }
  }
  uVar17 = (ulong)(((uint)(uVar25 >> 3) & 0x1fffffff) + uVar14);
  goto LAB_00101b3e;
  while (uVar25 = uVar25 + 1, uVar17 = local_90, uVar25 < (local_90 & 0xffffffff)) {
LAB_00101ba0:
    if (*(byte *)((long)puVar21 + uVar25) != *(byte *)((long)puVar26 + uVar25)) {
      uVar17 = uVar25 & 0xffffffff;
      break;
    }
  }
LAB_00101b3e:
  if (((uint)uVar17 < local_9c) &&
     (sVar27 = *(short *)((long)&c->p + (ulong)((int)sVar27 & 0x7fff) * 2 + 0x30000),
     uVar18 != 0 && (short)uVar23 < sVar27)) {
LAB_001016ca:
    local_84 = uVar28 - 0x24;
    while( true ) {
      uVar18 = uVar18 - 1;
      puVar2 = (uint *)(in + sVar27);
      if ((*(int *)(((uVar17 & 0xffffffff) - 3) + (long)puVar2) ==
           *(int *)((long)puVar26 + ((uVar17 & 0xffffffff) - 3))) && (*puVar2 == *puVar26)) break;
      sVar27 = *(short *)((long)&c->p + (ulong)((int)sVar27 & 0x7fff) * 2 + 0x30000);
      if ((sVar27 <= (short)uVar23) || (uVar18 == 0)) goto LAB_00101841;
    }
    uVar25 = 4;
    if (local_84 < 0xffffffe0) {
      if (*(ulong *)(puVar2 + 1) == *(ulong *)(puVar26 + 1)) {
        if (*(ulong *)(puVar2 + 3) == *(ulong *)(puVar26 + 3)) {
          if (*(ulong *)(puVar2 + 5) == *(ulong *)(puVar26 + 5)) {
            uVar25 = 0x24;
            if (*(ulong *)(puVar2 + 7) == *(ulong *)(puVar26 + 7)) goto LAB_00101765;
            uVar25 = *(ulong *)(puVar26 + 7) ^ *(ulong *)(puVar2 + 7);
            uVar14 = 0x1c;
          }
          else {
            uVar25 = *(ulong *)(puVar26 + 5) ^ *(ulong *)(puVar2 + 5);
            uVar14 = 0x14;
          }
        }
        else {
          uVar25 = *(ulong *)(puVar26 + 3) ^ *(ulong *)(puVar2 + 3);
          uVar14 = 0xc;
        }
      }
      else {
        uVar25 = *(ulong *)(puVar26 + 1) ^ *(ulong *)(puVar2 + 1);
        uVar14 = 4;
      }
    }
    else {
LAB_00101765:
      do {
        uVar14 = (uint)uVar25;
        if (uVar28 < uVar14 + 8) {
          if (uVar14 < uVar28) goto LAB_0010180b;
          goto LAB_001017bf;
        }
        puVar4 = (ulong *)((long)puVar2 + uVar25);
        puVar5 = (ulong *)((long)puVar26 + uVar25);
        uVar25 = (ulong)(uVar14 + 8);
      } while (*puVar4 == *puVar5);
      uVar25 = *puVar5 ^ *puVar4;
    }
    uVar9 = 0;
    if (uVar25 != 0) {
      for (; (uVar25 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    uVar14 = ((uint)(uVar9 >> 3) & 0x1fffffff) + uVar14;
    goto LAB_001017bf;
  }
LAB_00101841:
  uVar14 = (uint)uVar17;
  if (uVar12 <= uVar14) {
    uVar28 = (uint)((long)puVar26 - (long)puVar21);
    if ((3 < uVar14) || (uVar28 < 0x1001)) {
      bVar7 = ""[uVar28 - 1 >> (byte)(0x100 - uVar28 >> 0x1d)];
      puVar6 = (c->freqs).offset + ((ulong)""[uVar17 & 0xffffffff] - 0x1f);
      *puVar6 = *puVar6 + 1;
      uVar28 = (uint)bVar7 + (0x100 - uVar28 >> 0x1d) * 2;
      puVar6 = (c->freqs).offset + uVar28;
      *puVar6 = *puVar6 + 1;
      puVar6 = (c->split_stats).new_observations + (ulong)(8 < uVar14) + 8;
      *puVar6 = *puVar6 + 1;
      puVar6 = &(c->split_stats).num_new_observations;
      *puVar6 = *puVar6 + 1;
      puVar2 = (uint *)((long)(c->freqs).litlen + local_78 + -0x28);
      *puVar2 = *puVar2 | uVar14 << 0x17;
      *(short *)((long)(c->freqs).litlen + local_78 + -0x24) =
           (short)((long)puVar26 - (long)puVar21);
      *(short *)((long)(c->freqs).litlen + local_78 + -0x22) = (short)uVar28;
      *(undefined4 *)((long)(c->freqs).litlen + local_78 + -0x20) = 0;
      pbVar19 = (byte *)((long)puVar26 + 1);
      if ((long)(ulong)(uVar14 + 4) <= (long)puVar20 - (long)pbVar19) {
        iVar15 = uVar14 - 1;
        uVar14 = (int)pbVar19 - (int)in;
        do {
          if (uVar14 == 0x8000) {
            lVar16 = 0;
            do {
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x10) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x20) = auVar31;
              auVar31 = paddsw(*(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30),auVar32);
              *(undefined1 (*) [16])((long)&c->p + lVar16 + 0x30) = auVar31;
              lVar16 = lVar16 + 0x40;
            } while (lVar16 != 0x40000);
            in = in + 0x8000;
            uVar14 = 0;
          }
          *(short *)((long)&c->p + uVar29 * 2) = (short)uVar14;
          *(undefined2 *)((long)&c->p + (ulong)uVar14 * 2 + 0x30000) =
               *(undefined2 *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000);
          *(short *)((long)&c->p + (ulong)uVar22 * 2 + 0x10000) = (short)uVar14;
          puVar21 = (uint *)(pbVar19 + 1);
          pbVar19 = pbVar19 + 1;
          uVar29 = (ulong)((*puVar21 & 0xffffff) * 0x1e35a7bd >> 0x11);
          uVar22 = *puVar21 * 0x1e35a7bd >> 0x10;
          uVar14 = uVar14 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      local_78 = local_78 + 8;
      puVar26 = (uint *)((long)puVar26 + (uVar17 & 0xffffffff));
      goto LAB_00101a0e;
    }
  }
  bVar7 = (byte)*puVar26;
  puVar6 = (c->freqs).litlen + bVar7;
  *puVar6 = *puVar6 + 1;
  puVar6 = (c->split_stats).new_observations + ((bVar7 & 1) + (uint)(bVar7 >> 6) * 2);
  *puVar6 = *puVar6 + 1;
  puVar6 = &(c->split_stats).num_new_observations;
  *puVar6 = *puVar6 + 1;
  puVar26 = (uint *)((long)puVar26 + 1);
  piVar3 = (int *)((long)(c->freqs).litlen + local_78 + -0x28);
  *piVar3 = *piVar3 + 1;
LAB_00101a0e:
  if ((puVar24 <= puVar26) || (0xa323f < local_78)) {
    local_80 = (int)data;
    uVar17 = (ulong)(uint)((int)puVar26 - local_80);
    goto LAB_00101bec;
  }
  if ((((c->split_stats).num_new_observations < 0x200) ||
      (uVar17 = (long)puVar26 - (long)data,
      (long)puVar20 - (long)puVar26 < 5000 || (long)uVar17 < 5000)) ||
     (_Var11 = do_end_block_check(&c->split_stats,(u32)uVar17), auVar32 = _DAT_0010eac0, !_Var11))
  goto LAB_0010150d;
LAB_00101bec:
  deflate_finish_block(c,os,(u8 *)data,(u32)uVar17,(c->p).g.sequences,puVar26 == puVar20);
  if ((puVar26 == puVar20) || (data = puVar26, os->overflow == true)) {
    return;
  }
  goto LAB_00101493;
  while (uVar25 = uVar25 + 1, uVar14 = uVar28, uVar25 < (local_90 & 0xffffffff)) {
LAB_0010180b:
    if (in[uVar25 + (long)sVar27] != *(byte *)((long)puVar26 + uVar25)) {
      uVar14 = (uint)uVar25;
      break;
    }
  }
LAB_001017bf:
  if (((uint)uVar17 < uVar14) && (uVar17 = (ulong)uVar14, puVar21 = puVar2, local_9c <= uVar14)) {
    uVar17 = (ulong)uVar14;
    goto LAB_00101841;
  }
  sVar27 = *(short *)((long)&c->p + (ulong)((int)sVar27 & 0x7fff) * 2 + 0x30000);
  if ((sVar27 <= (short)uVar23) || (uVar18 == 0)) goto LAB_00101841;
  goto LAB_001016ca;
}

Assistant:

static void
deflate_compress_greedy(struct libdeflate_compressor * restrict c,
			const u8 *in, size_t in_nbytes,
			struct deflate_output_bitstream *os)
{
	const u8 *in_next = in;
	const u8 *in_end = in_next + in_nbytes;
	const u8 *in_cur_base = in_next;
	u32 max_len = DEFLATE_MAX_MATCH_LEN;
	u32 nice_len = MIN(c->nice_match_length, max_len);
	u32 next_hashes[2] = {0, 0};

	hc_matchfinder_init(&c->p.g.hc_mf);

	do {
		/* Starting a new DEFLATE block */

		const u8 * const in_block_begin = in_next;
		const u8 * const in_max_block_end = choose_max_block_end(
				in_next, in_end, SOFT_MAX_BLOCK_LENGTH);
		struct deflate_sequence *seq = c->p.g.sequences;
		u32 min_len;

		init_block_split_stats(&c->split_stats);
		deflate_begin_sequences(c, seq);
		min_len = calculate_min_match_len(in_next,
						  in_max_block_end - in_next,
						  c->max_search_depth);
		do {
			u32 length;
			u32 offset;

			adjust_max_and_nice_len(&max_len, &nice_len,
						in_end - in_next);
			length = hc_matchfinder_longest_match(
						&c->p.g.hc_mf,
						&in_cur_base,
						in_next,
						min_len - 1,
						max_len,
						nice_len,
						c->max_search_depth,
						next_hashes,
						&offset);

			if (length >= min_len &&
			    (length > DEFLATE_MIN_MATCH_LEN ||
			     offset <= 4096)) {
				/* Match found */
				deflate_choose_match(c, length, offset, true,
						     &seq);
				hc_matchfinder_skip_bytes(&c->p.g.hc_mf,
							  &in_cur_base,
							  in_next + 1,
							  in_end,
							  length - 1,
							  next_hashes);
				in_next += length;
			} else {
				/* No match found */
				deflate_choose_literal(c, *in_next++, true,
						       seq);
			}

			/* Check if it's time to output another block. */
		} while (in_next < in_max_block_end &&
			 seq < &c->p.g.sequences[SEQ_STORE_LENGTH] &&
			 !should_end_block(&c->split_stats,
					   in_block_begin, in_next, in_end));

		deflate_finish_block(c, os, in_block_begin,
				     in_next - in_block_begin,
				     c->p.g.sequences, in_next == in_end);
	} while (in_next != in_end && !os->overflow);
}